

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureViewTestViewSampling::initTextureObject
          (TextureViewTestViewSampling *this,bool is_view_texture,GLenum texture_target,
          GLenum view_texture_target)

{
  int iVar1;
  deUint32 dVar2;
  GLint GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *this_00;
  bool local_e43;
  bool local_e42;
  bool local_e41;
  GLuint *local_e40;
  char *local_e30;
  MessageBuilder local_e28;
  char *local_ca8;
  MessageBuilder local_ca0;
  char *local_b20;
  MessageBuilder local_b18;
  char *local_998;
  MessageBuilder local_990;
  char *local_810;
  MessageBuilder local_808;
  char *local_688;
  MessageBuilder local_680;
  char *local_500;
  MessageBuilder local_4f8;
  char *local_378;
  MessageBuilder local_370;
  char *local_1f0;
  char *local_1e8 [3];
  MessageBuilder local_1d0;
  undefined1 local_4f;
  undefined1 local_4e;
  bool local_4d;
  undefined1 local_4c;
  bool local_4b;
  undefined1 local_4a;
  bool local_49;
  bool is_view_cube_map_array_texture_target;
  bool is_view_cube_map_texture_target;
  GLuint GStack_48;
  bool is_view_arrayed_texture_target;
  bool is_texture_rectangle_texture_target;
  bool is_texture_multisample_texture_target;
  bool is_texture_cube_map_texture_target;
  bool is_texture_arrayed_texture_target;
  uint numlevels;
  uint numlayers;
  uint minlevel;
  uint minlayer;
  GLuint *to_id_ptr;
  long lStack_28;
  uint texture_depth;
  Functions *gl;
  GLenum local_18;
  GLenum view_texture_target_local;
  GLenum texture_target_local;
  bool is_view_texture_local;
  TextureViewTestViewSampling *this_local;
  
  gl._4_4_ = view_texture_target;
  local_18 = texture_target;
  view_texture_target_local._3_1_ = is_view_texture;
  _texture_target_local = this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  if ((view_texture_target_local._3_1_ & 1) == 0) {
    local_e40 = &this->m_to_id;
  }
  else {
    local_e40 = &this->m_view_to_id;
  }
  _minlevel = local_e40;
  if (gl._4_4_ == 0x9009) {
    to_id_ptr._4_4_ = 0xd;
  }
  else if (gl._4_4_ == 0x8513) {
    to_id_ptr._4_4_ = 7;
  }
  else {
    to_id_ptr._4_4_ = this->m_reference_texture_depth;
  }
  if (local_18 == 0x9009) {
    to_id_ptr._4_4_ = 0x12;
  }
  if (*local_e40 != 0) {
    (**(code **)(lStack_28 + 0x480))(1,local_e40);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glDeleteTextures() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1756);
  }
  (**(code **)(lStack_28 + 0x6f8))(1,_minlevel);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x175b);
  if ((view_texture_target_local._3_1_ & 1) != 0) {
    GStack_48 = 2;
    local_e41 = true;
    if (((local_18 != 0x8c18) && (local_e41 = true, local_18 != 0x8c1a)) &&
       (local_e41 = true, local_18 != 0x9102)) {
      local_e41 = local_18 == 0x9009;
    }
    local_49 = local_e41;
    local_4a = local_18 == 0x8513;
    local_e42 = local_18 == 0x9100 || local_18 == 0x9102;
    local_4b = local_e42;
    local_4c = local_18 == 0x84f5;
    local_e43 = true;
    if (((gl._4_4_ != 0x8c18) && (local_e43 = true, gl._4_4_ != 0x8c1a)) &&
       (local_e43 = true, gl._4_4_ != 0x9102)) {
      local_e43 = gl._4_4_ == 0x9009;
    }
    local_4d = local_e43;
    local_4e = gl._4_4_ == 0x8513;
    local_4f = gl._4_4_ == 0x9009;
    if ((local_e42) || ((bool)local_4c)) {
      numlevels = 0;
      GStack_48 = 1;
    }
    else {
      numlevels = 1;
    }
    if (((local_e41 == true) || ((!(bool)local_4a && ((bool)local_4e)))) ||
       ((!(bool)local_4a && ((bool)local_4f)))) {
      numlayers = 1;
    }
    else {
      numlayers = 0;
    }
    if (((bool)local_4a) || (!(bool)local_4f)) {
      if (((bool)local_4e) || ((bool)local_4f)) {
        _is_texture_rectangle_texture_target = 6;
      }
      else if (local_e43 == false) {
        _is_texture_rectangle_texture_target = 1;
      }
      else if ((local_e41 != false) || ((bool)local_4a)) {
        _is_texture_rectangle_texture_target = 2;
      }
      else {
        _is_texture_rectangle_texture_target = 1;
      }
    }
    else {
      _is_texture_rectangle_texture_target = 0xc;
    }
    (**(code **)(lStack_28 + 0x14b0))
              (*_minlevel,gl._4_4_,this->m_to_id,0x8058,numlevels,GStack_48,numlayers,
               _is_texture_rectangle_texture_target);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glTextureView() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x17a3);
    this->m_iteration_view_texture_minlayer = numlayers;
    this->m_iteration_view_texture_minlevel = numlevels;
    this->m_iteration_view_texture_numlayers = _is_texture_rectangle_texture_target;
    this->m_iteration_view_texture_numlevels = GStack_48;
    this->m_iteration_view_texture_target = gl._4_4_;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1d0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1d0,(char (*) [35])"Created a view for texture target ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
    local_1e8[0] = TextureViewUtilities::getTextureTargetString(gl._4_4_);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,local_1e8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [30])"from a parent texture target ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
    local_1f0 = TextureViewUtilities::getTextureTargetString(local_18);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1f0);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"using arguments: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])"minlayer:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&numlayers);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])"minlevel:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&numlevels);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])"numlayers:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&is_texture_rectangle_texture_target);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])"numlevels:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&stack0xffffffffffffffb8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    (**(code **)(lStack_28 + 0xb8))(gl._4_4_,*_minlevel);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glBindTexture() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x17b7);
    goto LAB_01148d80;
  }
  this->m_iteration_parent_texture_depth = 1;
  this->m_iteration_parent_texture_height = 1;
  this->m_iteration_parent_texture_n_levels = 1;
  this->m_iteration_parent_texture_n_samples = 1;
  this->m_iteration_parent_texture_width = 1;
  (**(code **)(lStack_28 + 0xb8))(local_18,*_minlevel);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x17c4);
  if ((local_18 == 0x9100) || (local_18 == 0x9102)) {
    GVar3 = getMaxConformantSampleCount(this,local_18,0x8058);
    this->m_max_color_texture_samples_gl_value = GVar3;
  }
  else {
    (**(code **)(lStack_28 + 0x868))(0x910e,&this->m_max_color_texture_samples_gl_value);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x17cf);
  }
  if (local_18 == 0xde0) {
    (**(code **)(lStack_28 + 0x1370))
              (0xde0,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glTexStorage1D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x17d8);
    this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_370,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_370,
                        (char (*) [63])
                        "Created an immutable parent texture object for texture target ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
    local_378 = TextureViewUtilities::getTextureTargetString(local_18);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_378);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2b1df89);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_n_mipmaps);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_370);
  }
  else if (local_18 == 0xde1) {
LAB_01147c78:
    (**(code **)(lStack_28 + 0x1380))
              (local_18,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width,
               this->m_reference_texture_height);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1802);
    this->m_iteration_parent_texture_height = this->m_reference_texture_height;
    this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_680,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_680,
                        (char (*) [63])
                        "Created an immutable parent texture object for texture target ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
    local_688 = TextureViewUtilities::getTextureTargetString(local_18);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_688);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2b1df89);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_n_mipmaps);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])"height:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_height);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_680);
  }
  else if (local_18 == 0x806f) {
LAB_01148a03:
    (**(code **)(lStack_28 + 0x1398))
              (local_18,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width,
               this->m_reference_texture_height,to_id_ptr._4_4_);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glTexStorage3D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1876);
    this->m_iteration_parent_texture_depth = to_id_ptr._4_4_;
    this->m_iteration_parent_texture_height = this->m_reference_texture_height;
    this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_e28,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_e28,
                        (char (*) [63])
                        "Created an immutable parent texture object for texture target ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
    local_e30 = TextureViewUtilities::getTextureTargetString(local_18);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_e30);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2b1df89);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_n_mipmaps);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])"height:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_height);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"depth:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)&to_id_ptr + 4));
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e28);
  }
  else if (local_18 == 0x84f5) {
    (**(code **)(lStack_28 + 0x1380))
              (0x84f5,1,0x8058,this->m_reference_texture_width,this->m_reference_texture_height);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glTexStorage2D() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1818);
    this->m_iteration_parent_texture_height = this->m_reference_texture_height;
    this->m_iteration_parent_texture_width = this->m_reference_texture_width;
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_808,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_808,
                        (char (*) [63])
                        "Created an immutable parent texture object for texture target ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
    local_810 = TextureViewUtilities::getTextureTargetString(local_18);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_810);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])"levels:1 ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])"height:[");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_height);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_808);
  }
  else {
    if (local_18 == 0x8513) goto LAB_01147c78;
    if (local_18 == 0x8c18) {
      (**(code **)(lStack_28 + 0x1380))
                (0x8c18,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width,
                 to_id_ptr._4_4_);
      dVar2 = (**(code **)(lStack_28 + 0x800))();
      glu::checkError(dVar2,"glTexStorage2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x17eb);
      this->m_iteration_parent_texture_depth = to_id_ptr._4_4_;
      this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
      this->m_iteration_parent_texture_width = this->m_reference_texture_width;
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_4f8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_4f8,
                          (char (*) [63])
                          "Created an immutable parent texture object for texture target ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
      local_500 = TextureViewUtilities::getTextureTargetString(local_18);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_500);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"depth:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)&to_id_ptr + 4));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2b1df89);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_n_mipmaps);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4f8);
    }
    else if (local_18 == 0x8c1a) {
      (**(code **)(lStack_28 + 0x1398))
                (0x8c1a,this->m_reference_texture_n_mipmaps,0x8058,this->m_reference_texture_width,
                 this->m_reference_texture_height,to_id_ptr._4_4_);
      dVar2 = (**(code **)(lStack_28 + 0x800))();
      glu::checkError(dVar2,"glTexStorage3D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                      ,0x182d);
      this->m_iteration_parent_texture_depth = to_id_ptr._4_4_;
      this->m_iteration_parent_texture_height = this->m_reference_texture_height;
      this->m_iteration_parent_texture_n_levels = this->m_reference_texture_n_mipmaps;
      this->m_iteration_parent_texture_width = this->m_reference_texture_width;
      pTVar5 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_990,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_990,
                          (char (*) [63])
                          "Created an immutable parent texture object for texture target ");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
      local_998 = TextureViewUtilities::getTextureTargetString(local_18);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_998);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"depth:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)&to_id_ptr + 4));
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])0x2b1df89);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_n_mipmaps);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])"height:[");
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_height);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_990);
    }
    else {
      if (local_18 == 0x9009) goto LAB_01148a03;
      if (local_18 == 0x9100) {
        (**(code **)(lStack_28 + 0x1390))
                  (0x9100,this->m_max_color_texture_samples_gl_value,0x8058,
                   this->m_reference_texture_width,this->m_reference_texture_height,1);
        dVar2 = (**(code **)(lStack_28 + 0x800))();
        glu::checkError(dVar2,"glTexStorage2DMultisample() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x1846);
        this->m_iteration_parent_texture_height = this->m_reference_texture_height;
        this->m_iteration_parent_texture_n_samples = this->m_max_color_texture_samples_gl_value;
        this->m_iteration_parent_texture_width = this->m_reference_texture_width;
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_b18,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_b18,
                            (char (*) [63])
                            "Created an immutable parent texture object for texture target ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
        local_b20 = TextureViewUtilities::getTextureTargetString(local_18);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_b20);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])"samples:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_max_color_texture_samples_gl_value)
        ;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])"height:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_height);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_b18);
      }
      else {
        if (local_18 != 0x9102) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognized texture target.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                     ,0x188b);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        (**(code **)(lStack_28 + 0x13a8))
                  (0x9102,this->m_max_color_texture_samples_gl_value,0x8058,
                   this->m_reference_texture_width,this->m_reference_texture_height,to_id_ptr._4_4_,
                   1);
        dVar2 = (**(code **)(lStack_28 + 0x800))();
        glu::checkError(dVar2,"glTexStorage3DMultisample() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                        ,0x185d);
        this->m_iteration_parent_texture_depth = to_id_ptr._4_4_;
        this->m_iteration_parent_texture_height = this->m_reference_texture_height;
        this->m_iteration_parent_texture_n_samples = this->m_max_color_texture_samples_gl_value;
        this->m_iteration_parent_texture_width = this->m_reference_texture_width;
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_ca0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_ca0,
                            (char (*) [63])
                            "Created an immutable parent texture object for texture target ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2c3fdfc);
        local_ca8 = TextureViewUtilities::getTextureTargetString(local_18);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_ca8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0x2c0d8d8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])"samples:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_max_color_texture_samples_gl_value)
        ;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"width:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_width);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [9])"height:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&this->m_reference_texture_height);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2a1cf32);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [8])"depth:[");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)((long)&to_id_ptr + 4));
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2af8aaf);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_ca0);
      }
    }
  }
  this->m_iteration_parent_texture_target = local_18;
LAB_01148d80:
  if (((local_18 != 0x9100) && (local_18 != 0x9102)) && (local_18 != 0x84f5)) {
    (**(code **)(lStack_28 + 0x1360))(local_18,0x2800,0x2600);
    (**(code **)(lStack_28 + 0x1360))(local_18,0x2801,0x2700);
    dVar2 = (**(code **)(lStack_28 + 0x800))();
    glu::checkError(dVar2,"glTexParameteri() call(s) failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                    ,0x1899);
  }
  return;
}

Assistant:

void TextureViewTestViewSampling::initTextureObject(bool is_view_texture, glw::GLenum texture_target,
													glw::GLenum view_texture_target)
{
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	unsigned int		  texture_depth = 0;
	glw::GLuint*		  to_id_ptr		= (is_view_texture) ? &m_view_to_id : &m_to_id;

	/* Sanity check: make sure GL_TEXTURE_BUFFER texture target is not requested. This
	 *               would be against the test specification.
	 **/
	DE_ASSERT(texture_target != GL_TEXTURE_BUFFER);
	DE_ASSERT(view_texture_target != GL_TEXTURE_BUFFER);

	/* If we're going to be creating a cube-map or cube-map array texture view in this iteration,
	 * make sure the parent or view texture's depth is valid */
	if (view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texture_depth = 13; /* 1 + 2 * (6 faces) */
	}
	else if (view_texture_target == GL_TEXTURE_CUBE_MAP)
	{
		texture_depth = 7; /* 1 + (6 faces) */
	}
	else
	{
		texture_depth = m_reference_texture_depth;
	}

	if (texture_target == GL_TEXTURE_CUBE_MAP_ARRAY)
	{
		texture_depth = 6 /* faces */ * 3;
	}

	/* Release the texture object, as we're using immutable texture objects and would
	 * prefer the resources not to leak.
	 */
	if (*to_id_ptr != 0)
	{
		gl.deleteTextures(1, to_id_ptr);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTextures() call failed.");
	}

	/* Generate a new texture object */
	gl.genTextures(1, to_id_ptr);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	if (is_view_texture)
	{
		/* Determine values of arguments we'll pass to glTextureView() call */
		unsigned int minlayer  = 0;
		unsigned int minlevel  = 0;
		unsigned int numlayers = 0;
		unsigned int numlevels = 2;

		const bool is_texture_arrayed_texture_target =
			(texture_target == GL_TEXTURE_1D_ARRAY || texture_target == GL_TEXTURE_2D_ARRAY ||
			 texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY || texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
		const bool is_texture_cube_map_texture_target = (texture_target == GL_TEXTURE_CUBE_MAP);
		const bool is_texture_multisample_texture_target =
			(texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY);
		const bool is_texture_rectangle_texture_target = (texture_target == GL_TEXTURE_RECTANGLE);
		const bool is_view_arrayed_texture_target =
			(view_texture_target == GL_TEXTURE_1D_ARRAY || view_texture_target == GL_TEXTURE_2D_ARRAY ||
			 view_texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY ||
			 view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);
		const bool is_view_cube_map_texture_target		 = (view_texture_target == GL_TEXTURE_CUBE_MAP);
		const bool is_view_cube_map_array_texture_target = (view_texture_target == GL_TEXTURE_CUBE_MAP_ARRAY);

		if (is_texture_multisample_texture_target || is_texture_rectangle_texture_target)
		{
			minlevel  = 0;
			numlevels = 1;
		}
		else
		{
			minlevel = 1;
		}

		if ((true == is_texture_arrayed_texture_target) ||
			((false == is_texture_cube_map_texture_target) && (true == is_view_cube_map_texture_target)) ||
			((false == is_texture_cube_map_texture_target) && (true == is_view_cube_map_array_texture_target)))
		{
			minlayer = 1;
		}
		else
		{
			minlayer = 0;
		}

		if (!is_texture_cube_map_texture_target && is_view_cube_map_array_texture_target)
		{
			numlayers = 12;
		}
		else if (is_view_cube_map_texture_target || is_view_cube_map_array_texture_target)
		{
			numlayers = 6;
		}
		else if (is_view_arrayed_texture_target)
		{
			if (is_texture_arrayed_texture_target || is_texture_cube_map_texture_target)
			{
				numlayers = 2;
			}
			else
			{
				numlayers = 1;
			}
		}
		else
		{
			numlayers = 1;
		}

		/* Set up view texture */
		gl.textureView(*to_id_ptr, view_texture_target, m_to_id, GL_RGBA8, minlevel, numlevels, minlayer, numlayers);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed.");

		/* Store the argument values */
		m_iteration_view_texture_minlayer  = minlayer;
		m_iteration_view_texture_minlevel  = minlevel;
		m_iteration_view_texture_numlayers = numlayers;
		m_iteration_view_texture_numlevels = numlevels;
		m_iteration_view_texture_target	= view_texture_target;

		m_testCtx.getLog() << tcu::TestLog::Message << "Created a view for texture target "
						   << "[" << TextureViewUtilities::getTextureTargetString(view_texture_target) << "] "
						   << "from a parent texture target "
						   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
						   << "using arguments: "
						   << "minlayer:[" << minlayer << "] "
						   << "minlevel:[" << minlevel << "] "
						   << "numlayers:[" << numlayers << "] "
						   << "numlevels:[" << numlevels << "]." << tcu::TestLog::EndMessage;

		gl.bindTexture(view_texture_target, *to_id_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");
	} /* if (is_view_texture) */
	else
	{
		/* Reset iteration-specific view settings */
		m_iteration_parent_texture_depth	 = 1;
		m_iteration_parent_texture_height	= 1;
		m_iteration_parent_texture_n_levels  = 1;
		m_iteration_parent_texture_n_samples = 1;
		m_iteration_parent_texture_width	 = 1;

		/* Initialize storage for the newly created texture object */
		gl.bindTexture(texture_target, *to_id_ptr);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		/* Use max conformant sample count for multisample texture targets */
		if (texture_target == GL_TEXTURE_2D_MULTISAMPLE || texture_target == GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
		{
			m_max_color_texture_samples_gl_value = getMaxConformantSampleCount(texture_target, GL_RGBA8);
		}
		else
		{
			/* Use GL_MAX_COLOR_TEXTURE_SAMPLES value for other targets */
			gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &m_max_color_texture_samples_gl_value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() call failed for GL_MAX_COLOR_TEXTURE_SAMPLES pname.");
		}

		switch (texture_target)
		{
		case GL_TEXTURE_1D:
		{
			gl.texStorage1D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage1D() call failed.");

			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "]." << tcu::TestLog::EndMessage;
			break;
		}

		case GL_TEXTURE_1D_ARRAY:
		{
			gl.texStorage2D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

			m_iteration_parent_texture_depth	= texture_depth;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "depth:[" << texture_depth << "] "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_CUBE_MAP:
		case GL_TEXTURE_2D:
		{
			gl.texStorage2D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							m_reference_texture_height);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

			m_iteration_parent_texture_height   = m_reference_texture_height;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_RECTANGLE:
		{
			gl.texStorage2D(texture_target, 1, /* rectangle textures do not use mip-maps */
							GL_RGBA8, m_reference_texture_width, m_reference_texture_height);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

			m_iteration_parent_texture_height = m_reference_texture_height;
			m_iteration_parent_texture_width  = m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:1 "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_2D_ARRAY:
		{
			gl.texStorage3D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							m_reference_texture_height, texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");

			m_iteration_parent_texture_depth	= texture_depth;
			m_iteration_parent_texture_height   = m_reference_texture_height;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "depth:[" << texture_depth << "] "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_2D_MULTISAMPLE:
		{
			gl.texStorage2DMultisample(texture_target, m_max_color_texture_samples_gl_value, GL_RGBA8,
									   m_reference_texture_width, m_reference_texture_height,
									   GL_TRUE); /* fixedsamplelocations */

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call failed.");

			m_iteration_parent_texture_height	= m_reference_texture_height;
			m_iteration_parent_texture_n_samples = m_max_color_texture_samples_gl_value;
			m_iteration_parent_texture_width	 = m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "samples:[" << m_max_color_texture_samples_gl_value << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		{
			gl.texStorage3DMultisample(texture_target, m_max_color_texture_samples_gl_value, GL_RGBA8,
									   m_reference_texture_width, m_reference_texture_height, texture_depth,
									   GL_TRUE); /* fixed sample locations */

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3DMultisample() call failed.");

			m_iteration_parent_texture_depth	 = texture_depth;
			m_iteration_parent_texture_height	= m_reference_texture_height;
			m_iteration_parent_texture_n_samples = m_max_color_texture_samples_gl_value;
			m_iteration_parent_texture_width	 = m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "samples:[" << m_max_color_texture_samples_gl_value << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "] "
							   << "depth:[" << texture_depth << "]." << tcu::TestLog::EndMessage;

			break;
		}

		case GL_TEXTURE_3D:
		case GL_TEXTURE_CUBE_MAP_ARRAY:
		{
			gl.texStorage3D(texture_target, m_reference_texture_n_mipmaps, GL_RGBA8, m_reference_texture_width,
							m_reference_texture_height, texture_depth);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage3D() call failed.");

			m_iteration_parent_texture_depth	= texture_depth;
			m_iteration_parent_texture_height   = m_reference_texture_height;
			m_iteration_parent_texture_n_levels = m_reference_texture_n_mipmaps;
			m_iteration_parent_texture_width	= m_reference_texture_width;

			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Created an immutable parent texture object for texture target "
							   << "[" << TextureViewUtilities::getTextureTargetString(texture_target) << "] "
							   << "of "
							   << "levels:[" << m_reference_texture_n_mipmaps << "] "
							   << "width:[" << m_reference_texture_width << "] "
							   << "height:[" << m_reference_texture_height << "] "
							   << "depth:[" << texture_depth << "]." << tcu::TestLog::EndMessage;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized texture target.");
		}
		} /* switch (texture_target) */

		m_iteration_parent_texture_target = texture_target;
	}

	/* Configure texture filtering */
	if (texture_target != GL_TEXTURE_2D_MULTISAMPLE && texture_target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY &&
		texture_target != GL_TEXTURE_RECTANGLE)
	{
		gl.texParameteri(texture_target, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		gl.texParameteri(texture_target, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call(s) failed.");
	}
}